

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uhttp_sample.c
# Opt level: O2

HTTP_CLIENT_HANDLE
create_uhttp_client_handle(HTTP_SAMPLE_INFO *sample_info,char *host_name,int port_num)

{
  IO_INTERFACE_DESCRIPTION *io_interface_desc;
  HTTP_CLIENT_HANDLE pHVar1;
  SOCKETIO_CONFIG config;
  char *local_28;
  undefined4 local_20;
  undefined8 local_18;
  
  local_18 = 0;
  local_28 = "httpbin.org";
  local_20 = 0x50;
  io_interface_desc = socketio_get_interface_description();
  pHVar1 = uhttp_client_create(io_interface_desc,&local_28,on_error,sample_info);
  return pHVar1;
}

Assistant:

static HTTP_CLIENT_HANDLE create_uhttp_client_handle(HTTP_SAMPLE_INFO* sample_info, const char* host_name, int port_num)
{
    SOCKETIO_CONFIG config;
    TLSIO_CONFIG tls_io_config;
    const void* xio_param;
    const IO_INTERFACE_DESCRIPTION* interface_desc;
    if (port_num == HTTPS_PORT_NUM)
    {
        tls_io_config.hostname = host_name;
        tls_io_config.port = port_num;
        tls_io_config.underlying_io_interface = NULL;
        tls_io_config.underlying_io_parameters = NULL;
        xio_param = &tls_io_config;
        // Get the TLS definition
        interface_desc = platform_get_default_tlsio();
    }
    else
    {
        config.accepted_socket = NULL;
        config.hostname = host_name;
        config.port = port_num;
        xio_param = &config;
        // Get the socket definition
        interface_desc = socketio_get_interface_description();
    }
    return uhttp_client_create(interface_desc, xio_param, on_error, sample_info);
}